

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O2

void __thiscall CodeGenerator::writeIncludes(CodeGenerator *this,ostream *s,Class *clazz)

{
  _Rb_tree_header *p_Var1;
  pointer pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  _Base_ptr p_Var3;
  iterator iVar4;
  ostream *poVar5;
  pointer pRVar6;
  undefined1 local_190 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
  i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  
  includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&includes;
  includes._M_t._M_impl._0_4_ = 0;
  includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  includes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var1 = &(this->m_classes)._M_t._M_impl.super__Rb_tree_header;
  includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  includes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  for (p_Var3 = (this->m_classes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
            *)local_190,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
            *)(p_Var3 + 1));
    if (*(long *)(i.first.field_2._8_8_ + 0x28) != 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (i.first.field_2._8_8_ + 0x20));
    }
    std::__cxx11::string::~string((string *)local_190);
  }
  pRVar2 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar6 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>.
                _M_impl.super__Vector_impl_data._M_start; pRVar6 != pRVar2; pRVar6 = pRVar6 + 1) {
    Replicator::Replicator((Replicator *)local_190,pRVar6);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                    *)includes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (key_type *)((long)&i.first.field_2 + 8));
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               (iVar4._M_node + 2);
      if (*(char *)&__rhs[7]._M_dataplus._M_p == '\0') {
        std::operator+(&local_90,"generated_",__rhs);
        std::operator+(&local_b0,&local_90,".h");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_70,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else if (__rhs[1]._M_string_length != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_70,__rhs + 1);
      }
    }
    Replicator::~Replicator((Replicator *)local_190);
  }
  for (p_Var3 = includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 != (_Rb_tree_node_base *)&includes; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)
      ) {
    std::__cxx11::string::string((string *)local_190,(string *)(p_Var3 + 1));
    poVar5 = std::operator<<(s,"#include \"");
    poVar5 = std::operator<<(poVar5,(string *)local_190);
    poVar5 = std::operator<<(poVar5,"\"");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)local_190);
  }
  std::endl<char,std::char_traits<char>>(s);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_70);
  return;
}

Assistant:

void CodeGenerator::writeIncludes(std::ostream &s, Class *clazz)
{
    std::set<std::string> includes;

    // First add all imported classes' includes.
    for (auto i : m_classes) {
        const Class *c = i.second;
        if (!c->include.empty())
            includes.insert(i.second->include);
    }
    // Then include all includes to classes we're replecating..
    // ### We should be checking for cyclic deps here..
    for (auto replicator : clazz->replicators) {
        auto classIt = m_classes.find(replicator.clazz);
        if (classIt != m_classes.end()) {
            Class *c = classIt->second;
            if (!c->declarationOnly) {
                // a generated class,
                includes.insert("generated_" + c->name + ".h");
            } else if (!c->include.empty()) {
                includes.insert(c->include);
            }
        }
    }

    for (auto i : includes)
        s << "#include \"" << i << "\"" << std::endl;
    s << std::endl;
}